

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastGtS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  int v1;
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  uint *puVar7;
  MessageLite **ppMVar8;
  MessageLite *pMVar9;
  ulong uVar10;
  string *psVar11;
  ushort *puVar12;
  char *pcVar13;
  ushort *puVar14;
  size_type sVar15;
  undefined8 uVar16;
  int iVar17;
  Arena *arena;
  pointer pcVar18;
  ushort *local_40 [2];
  
  if (data.field_0._0_1_ != '\0') {
    pcVar13 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar13;
  }
  bVar3 = *ptr;
  if ((ulong)table->has_bits_offset != 0) {
    puVar7 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar7 = *puVar7 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  ppMVar8 = RefAt<google::protobuf::MessageLite*>(msg,(ulong)data.field_0 >> 0x30);
  lVar4 = *(long *)((long)&table->has_bits_offset +
                   ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  pMVar9 = *ppMVar8;
  if (pMVar9 == (MessageLite *)0x0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar9 = ClassData::New(*(ClassData **)(lVar4 + 0x20),arena);
    *ppMVar8 = pMVar9;
  }
  iVar17 = ctx->depth_;
  v1 = iVar17 + -1;
  ctx->depth_ = v1;
  if (iVar17 < 1) {
    puVar12 = (ushort *)0x0;
  }
  else {
    local_40[0] = (ushort *)(ptr + 1);
    iVar17 = ctx->group_depth_ + 1;
    ctx->group_depth_ = iVar17;
    while (bVar5 = ParseContext::Done(ctx,(char **)local_40), !bVar5) {
      uVar6 = (uint)*(byte *)(lVar4 + 8) & (uint)*local_40[0];
      if ((uVar6 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x44d);
      }
      uVar10 = (ulong)(uVar6 & 0xfffffff8);
      local_40[0] = (ushort *)
                    (**(code **)(lVar4 + 0x38 + uVar10 * 2))
                              (pMVar9,local_40[0],ctx,
                               (ulong)*local_40[0] ^ *(ulong *)(lVar4 + 0x40 + uVar10 * 2),lVar4,0);
      if ((local_40[0] == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)
         ) break;
    }
    puVar14 = local_40[0];
    if ((*(byte *)(lVar4 + 9) & 1) != 0) {
      puVar14 = (ushort *)(**(code **)(lVar4 + 0x28))(pMVar9,local_40[0],ctx);
    }
    if (puVar14 != (ushort *)0x0) {
      psVar11 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                          (v1,ctx->depth_,"old_depth == depth_");
      if (psVar11 != (string *)0x0) {
        pcVar18 = (psVar11->_M_dataplus)._M_p;
        sVar15 = psVar11->_M_string_length;
        uVar16 = 0x45b;
LAB_00143da6:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,uVar16,sVar15,pcVar18);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_40);
      }
      psVar11 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                          (iVar17,ctx->group_depth_,"old_group_depth == group_depth_");
      if (psVar11 != (string *)0x0) {
        pcVar18 = (psVar11->_M_dataplus)._M_p;
        sVar15 = psVar11->_M_string_length;
        uVar16 = 0x45c;
        goto LAB_00143da6;
      }
    }
    uVar1 = ctx->depth_;
    uVar2 = ctx->group_depth_;
    ctx->depth_ = uVar1 + 1;
    ctx->group_depth_ = uVar2 + -1;
    uVar6 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    puVar12 = (ushort *)0x0;
    if (uVar6 == bVar3) {
      puVar12 = puVar14;
    }
  }
  return (char *)puVar12;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGtS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint8_t, true, true>(
      PROTOBUF_TC_PARAM_PASS);
}